

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O3

void __thiscall board::Board::reset(Board *this)

{
  int *piVar1;
  pointer pUVar2;
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar6;
  
  lVar4 = 0;
  do {
    piVar1 = this->board + lVar4;
    piVar1[0] = 99;
    piVar1[1] = 99;
    piVar1[2] = 99;
    piVar1[3] = 99;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x78);
  lVar4 = 0;
  do {
    this->board[*(int *)((long)SQ120 + lVar4)] = 0;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x100);
  lVar4 = 0;
  memset(this->pawns,0,0x220);
  auVar3 = _DAT_00109110;
  auVar5 = _DAT_00109150;
  auVar7 = _DAT_001090a0;
  do {
    auVar8 = auVar7 ^ auVar3;
    if (auVar8._4_4_ == -0x80000000 && auVar8._0_4_ < -0x7ffffff3) {
      this->pNum[lVar4] = 0;
      this->pNum[lVar4 + 1] = 0;
    }
    auVar8 = auVar5 ^ auVar3;
    if (auVar8._4_4_ == -0x80000000 && auVar8._0_4_ < -0x7ffffff3) {
      this->pNum[lVar4 + 2] = 0;
      this->pNum[lVar4 + 3] = 0;
    }
    lVar4 = lVar4 + 4;
    lVar6 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 4;
    auVar7._8_8_ = lVar6 + 4;
    lVar6 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 4;
    auVar5._8_8_ = lVar6 + 4;
  } while (lVar4 != 0x10);
  this->material[0] = 0;
  this->material[1] = 0;
  this->side = 2;
  this->ply = 0;
  this->fiftyMove = 0;
  this->enPas = 99;
  this->castlePerm = 0;
  this->hashKey = 0;
  pUVar2 = (this->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
      super__Vector_impl_data._M_finish != pUVar2) {
    (this->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
    super__Vector_impl_data._M_finish = pUVar2;
  }
  memset(this->searchHistory,0,0x1a60);
  return;
}

Assistant:

void board::Board::reset()
{
    std::fill(std::begin(board), std::end(board), NO_SQ);
    for (int i : SQ120) {
        board[i] = EMPTY;
    }
    std::fill(std::begin(pawns), std::end(pawns), 0ULL);
    for (int i = 0; i < 13; i++) {
        pNum[i] = 0;
        for (int j = 0; j < 10; j++) {
            pList[i][j] = 0;
        }
    }
    material[WHITE] = 0;
    material[BLACK] = 0;
    side = BOTH;
    ply = 0;
    fiftyMove = 0;
    enPas = NO_SQ;
    castlePerm = 0;
    hashKey = 0ULL;
    history.clear();
    clearSearchKillers();
    clearSearchHistory();
}